

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

void __thiscall Function::print(Function *this)

{
  ostream *poVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long local_50;
  long local_48;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"def ");
  (*(this->super_Statement)._vptr_Statement[3])((string *)&local_50,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  std::operator<<(poVar1,"(");
  std::__cxx11::string::~string((string *)&local_50);
  lVar3 = 0;
  uVar2 = 0;
  while( true ) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_50,&this->_paramenters);
    lVar4 = local_48 - local_50;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_50);
    if ((ulong)(lVar4 >> 5) <= uVar2) break;
    if (lVar3 != 0) {
      std::operator<<((ostream *)&std::cout,",");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_50,&this->_paramenters);
    std::operator<<((ostream *)&std::cout,(string *)(local_50 + lVar3));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_50);
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x20;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"):");
  std::endl<char,std::char_traits<char>>(poVar1);
  Statements::print(this->_statements);
  return;
}

Assistant:

void Function::print() {
    std::cout <<"def "<< id() << "(";
    for(int i = 0; i < paramenters().size();i++){
        if(i != 0)std::cout << ",";
        std::cout << paramenters()[i];
    }
    std::cout << "):" << std::endl;
    statements()->print();
}